

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O0

int amqp_encode_array(amqp_bytes_t encoded,amqp_array_t *input,size_t *offset)

{
  amqp_bytes_t encoded_00;
  amqp_bytes_t encoded_01;
  int iVar1;
  amqp_field_value_t *in_RCX;
  int *in_RDX;
  void *in_RDI;
  int res;
  int i;
  size_t start;
  int local_30;
  uint32_t input_00;
  size_t *offset_00;
  
  offset_00 = *(size_t **)in_RCX;
  *(long *)in_RCX = *(long *)in_RCX + 4;
  input_00 = 0;
  while( true ) {
    if (*in_RDX <= (int)input_00) {
      encoded_00.bytes = in_RDX;
      encoded_00.len = (size_t)in_RCX;
      iVar1 = amqp_encode_32(encoded_00,offset_00,input_00);
      if (iVar1 == 0) {
        local_30 = -0xb;
      }
      else {
        local_30 = 0;
      }
      return local_30;
    }
    encoded_01.bytes = in_RDI;
    encoded_01.len = (size_t)in_RDX;
    iVar1 = amqp_encode_field_value(encoded_01,in_RCX,offset_00);
    if (iVar1 < 0) break;
    input_00 = input_00 + 1;
  }
  return iVar1;
}

Assistant:

static int amqp_encode_array(amqp_bytes_t encoded,
                             amqp_array_t *input,
                             size_t *offset)
{
  size_t start = *offset;
  int i, res;

  *offset += 4; /* size of the array gets filled in later on */

  for (i = 0; i < input->num_entries; i++) {
    res = amqp_encode_field_value(encoded, &input->entries[i], offset);
    if (res < 0) {
      goto out;
    }
  }

  if (!amqp_encode_32(encoded, &start, *offset - start - 4)) {
    res = AMQP_STATUS_TABLE_TOO_BIG;
    goto out;
  }

  res = AMQP_STATUS_OK;

out:
  return res;
}